

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O2

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this,Feature f)

{
  int iVar1;
  char *__s;
  allocator<char> local_11;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    __s = "threads";
    break;
  case 2:
    __s = "mutable-globals";
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00b1e0c0_caseD_3:
    handle_unreachable("unexpected feature",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-features.h"
                       ,0x74);
  case 4:
    __s = "nontrapping-float-to-int";
    break;
  case 8:
    __s = "simd";
    break;
  default:
    if (iVar1 == 0x10) {
      __s = "bulk-memory";
    }
    else if (iVar1 == 0x20) {
      __s = "sign-ext";
    }
    else if (iVar1 == 0x40) {
      __s = "exception-handling";
    }
    else if (iVar1 == 0x80) {
      __s = "tail-call";
    }
    else if (iVar1 == 0x100) {
      __s = "reference-types";
    }
    else if (iVar1 == 0x200) {
      __s = "multivalue";
    }
    else if (iVar1 == 0x400) {
      __s = "gc";
    }
    else if (iVar1 == 0x800) {
      __s = "memory64";
    }
    else if (iVar1 == 0x1000) {
      __s = "relaxed-simd";
    }
    else if (iVar1 == 0x2000) {
      __s = "extended-const";
    }
    else if (iVar1 == 0x4000) {
      __s = "strings";
    }
    else if (iVar1 == 0x8000) {
      __s = "multimemory";
    }
    else if (iVar1 == 0x10000) {
      __s = "stack-switching";
    }
    else if (iVar1 == 0x20000) {
      __s = "shared-everything";
    }
    else if (iVar1 == 0x40000) {
      __s = "fp16";
    }
    else if (iVar1 == 0x80000) {
      __s = "bulk-memory-opt";
    }
    else if (iVar1 == 0x100000) {
      __s = "call-indirect-overlong";
    }
    else {
      if (iVar1 != 0x200000) goto switchD_00b1e0c0_caseD_3;
      __s = "custom-descriptors";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(Feature f) {
    switch (f) {
      case Atomics:
        return "threads";
      case MutableGlobals:
        return "mutable-globals";
      case TruncSat:
        return "nontrapping-float-to-int";
      case SIMD:
        return "simd";
      case BulkMemory:
        return "bulk-memory";
      case SignExt:
        return "sign-ext";
      case ExceptionHandling:
        return "exception-handling";
      case TailCall:
        return "tail-call";
      case ReferenceTypes:
        return "reference-types";
      case Multivalue:
        return "multivalue";
      case GC:
        return "gc";
      case Memory64:
        return "memory64";
      case RelaxedSIMD:
        return "relaxed-simd";
      case ExtendedConst:
        return "extended-const";
      case Strings:
        return "strings";
      case MultiMemory:
        return "multimemory";
      case StackSwitching:
        return "stack-switching";
      case SharedEverything:
        return "shared-everything";
      case FP16:
        return "fp16";
      case BulkMemoryOpt:
        return "bulk-memory-opt";
      case CallIndirectOverlong:
        return "call-indirect-overlong";
      case CustomDescriptors:
        return "custom-descriptors";
      case MVP:
      case Default:
      case All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature");
  }